

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

string * __thiscall
Diligent::FormatString<unsigned_long,char[18],char_const*,char[45]>
          (string *__return_storage_ptr__,Diligent *this,unsigned_long *Args,char (*Args_1) [18],
          char **Args_2,char (*Args_3) [45])

{
  stringstream local_1b8 [8];
  stringstream ss;
  char (*Args_local_3) [45];
  char **Args_local_2;
  char (*Args_local_1) [18];
  unsigned_long *Args_local;
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,unsigned_long,char[18],char_const*,char[45]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (unsigned_long *)this,(char (*) [18])Args,(char **)Args_1,(char (*) [45])Args_2);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}